

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad>::CalcStiffT<std::complex<double>>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad> *this,
          TPZElementMatrixT<std::complex<double>_> *ek,TPZElementMatrixT<std::complex<double>_> *ef)

{
  long lVar1;
  int64_t iVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ostream *poVar8;
  long *plVar9;
  TPZIntPoints *rval;
  long lVar10;
  uint uVar11;
  long lVar12;
  TPZCompElSide *pTVar13;
  int *piVar14;
  bool bVar15;
  TPZAutoPointer<TPZIntPoints> intrule;
  int order;
  REAL weight;
  TPZGeoEl *pTStack_40500;
  long *plStack_404f8;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad> *pTStack_404f0;
  REAL detJac;
  TPZManVector<int,_4> ordervec;
  TPZManVector<int,_4> intorder;
  TPZManVector<double,_4> intpointtemp;
  TPZFMatrix<double> jac;
  TPZFMatrix<double> jacInv;
  TPZFMatrix<double> axe;
  TPZManVector<TPZTransform<double>,_10> trvec;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6> datavec;
  
  lVar7 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))();
  if (lVar7 != 0) {
    plStack_404f8 =
         (long *)__dynamic_cast(lVar7,&TPZMaterial::typeinfo,
                                &TPZMatCombinedSpacesT<std::complex<double>>::typeinfo,
                                0xfffffffffffffffe);
    if (plStack_404f8 != (long *)0x0) {
      lVar7 = __dynamic_cast(lVar7,&TPZMaterial::typeinfo,
                             &TPZNullMaterialCS<std::complex<double>>::typeinfo,0);
      if (lVar7 == 0) {
        (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xf8))
                  (this,ek,ef);
        iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))
                          (this);
        if (iVar3 != 0) {
          TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6>::TPZManVector(&datavec,0);
          lVar7 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
          (*datavec.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>._vptr_TPZVec[3])
                    (&datavec,lVar7);
          (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x290))
                    (this,&datavec,0);
          TPZManVector<TPZTransform<double>,_10>::TPZManVector(&trvec,0);
          (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))
                    (this,&trvec);
          iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb0
                              ))(this);
          TPZAutoPointer<TPZIntPoints>::TPZAutoPointer(&intrule);
          jac.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)0x0;
          TPZManVector<double,_4>::TPZManVector(&intpointtemp,2,(double *)&jac);
          weight = 0.0;
          TPZManVector<int,_4>::TPZManVector(&ordervec,0);
          lVar12 = 0;
          if (lVar7 < 1) {
            lVar7 = lVar12;
          }
          lVar10 = 17000;
          pTStack_404f0 = this;
          while (bVar15 = lVar7 != 0, lVar7 = lVar7 + -1, bVar15) {
            lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                             lVar12);
            if (lVar1 != 0) {
              plVar9 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                              &TPZInterpolationSpace::typeinfo,0);
              if (plVar9 != (long *)0x0) {
                TPZManVector<int,_4>::Resize(&ordervec,ordervec.super_TPZVec<int>.fNElements + 1);
                iVar2 = ordervec.super_TPZVec<int>.fNElements;
                uVar4 = (**(code **)(*plVar9 + 0x268))(plVar9);
                *(undefined4 *)
                 ((long)((datavec.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>.fStore)->
                        super_TPZMaterialData).super_TPZShapeData.fCornerNodeIds.fExtAlloc +
                 lVar10 + -0x30) = uVar4;
                *(undefined4 *)
                 ((long)ordervec.super_TPZVec<int>.fStore + ((iVar2 << 0x20) + -0x100000000 >> 0x1e)
                 ) = uVar4;
                this = pTStack_404f0;
              }
            }
            lVar10 = lVar10 + 0xa850;
            lVar12 = lVar12 + 0x10;
          }
          order = (**(code **)(*plStack_404f8 + 0x48))(plStack_404f8,&ordervec);
          pTStack_40500 = TPZCompEl::Reference((TPZCompEl *)this);
          iVar5 = (**(code **)(*(long *)pTStack_40500 + 0xf0))();
          rval = (TPZIntPoints *)
                 (**(code **)(*(long *)pTStack_40500 + 0x70))(pTStack_40500,iVar5 + -1,order);
          TPZAutoPointer<TPZIntPoints>::operator=(&intrule,rval);
          TPZManVector<int,_4>::TPZManVector(&intorder,(long)iVar3,&order);
          (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[5])((intrule.fRef)->fPointer,&intorder,0);
          uVar6 = (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[3])();
          if (1000 < (int)uVar6) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
                       ,0x36d);
          }
          TPZFMatrix<double>::TPZFMatrix(&jac);
          TPZFMatrix<double>::TPZFMatrix(&axe);
          TPZFMatrix<double>::TPZFMatrix(&jacInv);
          if ((int)uVar6 < 1) {
            uVar6 = 0;
          }
          for (uVar11 = 0; uVar11 != uVar6; uVar11 = uVar11 + 1) {
            (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[4])
                      ((intrule.fRef)->fPointer,(ulong)uVar11,&intpointtemp,&weight);
            TPZGeoEl::Jacobian(pTStack_40500,&intpointtemp.super_TPZVec<double>,&jac,&axe,&detJac,
                               &jacInv);
            weight = ABS(detJac) * weight;
            pTVar13 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore;
            lVar7 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
            if (lVar7 < 1) {
              lVar7 = 0;
            }
            piVar14 = &((datavec.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>.fStore)->
                       super_TPZMaterialData).intLocPtIndex;
            while (this = pTStack_404f0, bVar15 = lVar7 != 0, lVar7 = lVar7 + -1, bVar15) {
              if (pTVar13->fEl != (TPZCompEl *)0x0) {
                lVar12 = __dynamic_cast(pTVar13->fEl,&TPZCompEl::typeinfo,
                                        &TPZInterpolationSpace::typeinfo,0);
                if (lVar12 != 0) {
                  *piVar14 = uVar11;
                }
              }
              pTVar13 = pTVar13 + 1;
              piVar14 = piVar14 + 0x2a14;
            }
            (**(code **)(*(long *)&(pTStack_404f0->super_TPZMultiphysicsElement).super_TPZCompEl +
                        0x2b0))(pTStack_404f0,&intpointtemp,&trvec,&datavec);
            (**(code **)(*plStack_404f8 + 0x68))(weight,plStack_404f8,&datavec,&ek->fMat,&ef->fMat);
          }
          CleanupMaterialDataT<std::complex<double>>
                    (this,&datavec.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>);
          TPZFMatrix<double>::~TPZFMatrix(&jacInv);
          TPZFMatrix<double>::~TPZFMatrix(&axe);
          TPZFMatrix<double>::~TPZFMatrix(&jac);
          TPZManVector<int,_4>::~TPZManVector(&intorder);
          TPZManVector<int,_4>::~TPZManVector(&ordervec);
          TPZManVector<double,_4>::~TPZManVector(&intpointtemp);
          TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&intrule);
          TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&trvec);
          TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6>::~TPZManVector(&datavec);
        }
      }
      else {
        TPZElementMatrixT<std::complex<double>_>::Reset(ek,(TPZCompMesh *)0x0,Unknown);
        TPZElementMatrixT<std::complex<double>_>::Reset(ef,(TPZCompMesh *)0x0,Unknown);
        (ek->super_TPZElementMatrix).fType = EK;
        (ef->super_TPZElementMatrix).fType = EF;
      }
      return;
    }
  }
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error at ");
  poVar8 = std::operator<<(poVar8,
                           "void TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad>::CalcStiffT(TPZElementMatrixT<TVar> &, TPZElementMatrixT<TVar> &) [TGeometry = pzgeom::TPZGeoQuad, TVar = std::complex<double>]"
                          );
  std::operator<<(poVar8," this->Material() == NULL\n");
  TPZElementMatrixT<std::complex<double>_>::Reset(ek,(TPZCompMesh *)0x0,Unknown);
  TPZElementMatrixT<std::complex<double>_>::Reset(ef,(TPZCompMesh *)0x0,Unknown);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CalcStiffT(TPZElementMatrixT<TVar> &ek, TPZElementMatrixT<TVar> &ef)
{
    TPZMaterial * material = Material();
    auto *matCombined =
       dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(material);
    if(!material || !matCombined){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        ek.Reset();
        ef.Reset();
        return;
    }
    
    auto *nullmat = dynamic_cast<TPZNullMaterialCS<TVar> *>(material);
    if(nullmat)
    {
        ek.Reset();
        ef.Reset();
        ek.fType = TPZElementMatrix::EK;
        ef.fType = TPZElementMatrix::EF;
        return;
    }
    InitializeElementMatrix(ek,ef);
    
    if (this->NConnects() == 0) return;//boundary discontinuous elements have this characteristic
    
    TPZManVector<TPZMaterialDataT<TVar>,6> datavec;
    const int64_t nref = fElementVec.size();
    datavec.resize(nref);
    InitMaterialData(datavec);
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    int dim = Dimension();
    TPZAutoPointer<TPZIntPoints> intrule;
    
    TPZManVector<REAL,4> intpointtemp(TGeometry::Dimension,0.);
    REAL weight = 0.;
    
    TPZManVector<int,4> ordervec;
    //ordervec.resize(nref);
    for (int64_t iref=0;  iref<nref; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        int svec;
        if(msp)
        {
            ordervec.Resize(ordervec.size()+1);
            svec = ordervec.size();
        }
        else
        {
            continue;
        }
        datavec[iref].p = msp->MaxOrder();
        ordervec[svec-1] = datavec[iref].p;
    }
    
    int order = matCombined->IntegrationRuleOrder(ordervec);
    
    TPZGeoEl *ref = this->Reference();
    intrule = ref->CreateSideIntegrationRule(ref->NSides()-1, order);
    
    TPZManVector<int,4> intorder(dim,order);
    intrule->SetOrder(intorder);
    int intrulepoints = intrule->NPoints();
    if(intrulepoints > 1000) {
        DebugStop();
    }
    
    TPZFMatrix<REAL> jac, axe, jacInv;
    REAL detJac;
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule->Point(int_ind,intpointtemp,weight);
        ref->Jacobian(intpointtemp, jac, axe, detJac , jacInv);
        weight *= fabs(detJac);
        for (int i = 0; i < fElementVec.size(); i++) {
            TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[i].Element());
            if (!msp) {
                continue;
            }
            datavec[i].intLocPtIndex = int_ind;
        }
        
        this->ComputeRequiredData(intpointtemp,trvec,datavec);
        
        matCombined->Contribute(datavec,weight,ek.fMat,ef.fMat);
    }//loop over integration points
    
    CleanupMaterialData(datavec);
}